

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O0

void __thiscall Catch::Matchers::IsEmptyMatcher::IsEmptyMatcher(IsEmptyMatcher *this)

{
  IsEmptyMatcher *this_local;
  
  MatcherGenericBase::MatcherGenericBase(&this->super_MatcherGenericBase);
  (this->super_MatcherGenericBase).super_MatcherUntypedBase._vptr_MatcherUntypedBase =
       (_func_int **)&PTR__IsEmptyMatcher_00502498;
  return;
}

Assistant:

bool match(RangeLike&& rng) const {
#if defined(CATCH_CONFIG_POLYFILL_NONMEMBER_CONTAINER_ACCESS)
                using Catch::Detail::empty;
#else
                using std::empty;
#endif
                return empty(rng);
            }